

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

void CheckBlockDataAvailability(BlockManager *blockman,CBlockIndex *blockindex,bool check_for_undo)

{
  bool bVar1;
  UniValue *__return_storage_ptr__;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  char **local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((blockindex->nStatus & (int)CONCAT71(in_register_00000011,check_for_undo) * 8 + 8U) == 0) {
    bVar1 = node::BlockManager::IsBlockPruned(blockman,blockindex);
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    if (bVar1) {
      local_50 = (char **)0xf9d34f;
      if (check_for_undo) {
        local_50 = (char **)0xfbb448;
      }
      tinyformat::format<char_const*>
                (&local_48,(tinyformat *)"%s not available (pruned data)",(char *)&local_50,local_50
                );
      JSONRPCError(__return_storage_ptr__,-1,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      if (check_for_undo) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Undo data not available","");
        JSONRPCError(__return_storage_ptr__,-1,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Block not available (not fully downloaded)","");
        JSONRPCError(__return_storage_ptr__,-1,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckBlockDataAvailability(BlockManager& blockman, const CBlockIndex& blockindex, bool check_for_undo)
{
    AssertLockHeld(cs_main);
    uint32_t flag = check_for_undo ? BLOCK_HAVE_UNDO : BLOCK_HAVE_DATA;
    if (!(blockindex.nStatus & flag)) {
        if (blockman.IsBlockPruned(blockindex)) {
            throw JSONRPCError(RPC_MISC_ERROR, strprintf("%s not available (pruned data)", check_for_undo ? "Undo data" : "Block"));
        }
        if (check_for_undo) {
            throw JSONRPCError(RPC_MISC_ERROR, "Undo data not available");
        }
        throw JSONRPCError(RPC_MISC_ERROR, "Block not available (not fully downloaded)");
    }
}